

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ReflectionClassGenerator *this_00;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  EnumDescriptor *extraout_RDX_02;
  EnumDescriptor *extraout_RDX_03;
  EnumDescriptor *extraout_RDX_04;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *pFVar3;
  int i;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Printer *local_40;
  ReflectionClassGenerator *local_38;
  
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x4b) != '\x01') {
    __return_storage_ptr__ = &local_78;
    local_38 = this;
    GetClassName_abi_cxx11_(__return_storage_ptr__,(csharp *)descriptor,(Descriptor *)printer);
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
               (char (*) [10])0x3aca74,__return_storage_ptr__);
    paVar1 = &local_78.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    local_40 = printer;
    if ((long)*(int *)(descriptor + 0x68) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_58,(long)*(int *)(descriptor + 0x68));
      if (0 < *(int *)(descriptor + 0x68)) {
        lVar6 = 0;
        lVar4 = 0;
        pFVar3 = extraout_RDX;
        do {
          GetPropertyName_abi_cxx11_
                    (&local_78,(csharp *)(*(long *)(descriptor + 0x28) + lVar6),pFVar3);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     &local_78);
          pFVar3 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p);
            pFVar3 = extraout_RDX_01;
          }
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 0x98;
        } while (lVar4 < *(int *)(descriptor + 0x68));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_78,(protobuf *)&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)__return_storage_ptr__);
      printer = local_40;
      __return_storage_ptr__ = &local_78;
      io::Printer::Print<char[7],std::__cxx11::string>
                (local_40,"new[]{ \"$fields$\" }, ",(char (*) [7])0x3e9f5b,__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
    }
    if ((long)*(int *)(descriptor + 0x6c) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_58,(long)*(int *)(descriptor + 0x6c));
      if (0 < *(int *)(descriptor + 0x6c)) {
        lVar6 = 0;
        lVar4 = 0;
        do {
          __return_storage_ptr__ = (string *)0x0;
          UnderscoresToCamelCase
                    (&local_78,*(string **)(*(long *)(descriptor + 0x30) + lVar6),true,false);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     &local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 0x30;
        } while (lVar4 < *(int *)(descriptor + 0x6c));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_78,(protobuf *)&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\", \"",(char *)__return_storage_ptr__);
      printer = local_40;
      __return_storage_ptr__ = &local_78;
      io::Printer::Print<char[7],std::__cxx11::string>
                (local_40,"new[]{ \"$oneofs$\" }, ",(char (*) [7])"oneofs",__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
    }
    if ((long)*(int *)(descriptor + 0x74) < 1) {
      io::Printer::Print<>(printer,"null, ");
      pFVar3 = extraout_RDX_06;
    }
    else {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_58,(long)*(int *)(descriptor + 0x74));
      if (0 < *(int *)(descriptor + 0x74)) {
        lVar6 = 0;
        lVar4 = 0;
        descriptor_00 = extraout_RDX_02;
        do {
          GetClassName_abi_cxx11_
                    (&local_78,(csharp *)(*(long *)(descriptor + 0x40) + lVar6),descriptor_00);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     &local_78);
          descriptor_00 = extraout_RDX_03;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            operator_delete(local_78._M_dataplus._M_p);
            descriptor_00 = extraout_RDX_04;
          }
          lVar4 = lVar4 + 1;
          lVar6 = lVar6 + 0x50;
        } while (lVar4 < *(int *)(descriptor + 0x74));
      }
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_78,(protobuf *)&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"), typeof(",(char *)__return_storage_ptr__);
      printer = local_40;
      __return_storage_ptr__ = &local_78;
      io::Printer::Print<char[6],std::__cxx11::string>
                (local_40,"new[]{ typeof($enums$) }, ",(char (*) [6])0x39a9f1,__return_storage_ptr__
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      pFVar3 = extraout_RDX_05;
    }
    if (*(int *)(descriptor + 0x7c) < 1) {
      io::Printer::Print<>(printer,"null, ");
    }
    else {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = 0;
      lVar4 = 0;
      do {
        GetFullExtensionName_abi_cxx11_
                  (&local_78,(csharp *)(*(long *)(descriptor + 0x50) + lVar6),pFVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   &local_78);
        pFVar3 = extraout_RDX_07;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
          pFVar3 = extraout_RDX_08;
        }
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 0x98;
      } while (lVar4 < *(int *)(descriptor + 0x7c));
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_78,(protobuf *)&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x3af5c0,(char *)__return_storage_ptr__);
      printer = local_40;
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_40,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x39ade2,&local_78
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
    }
    if (*(int *)(descriptor + 0x70) < 1) {
      pcVar5 = "null";
    }
    else {
      io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] { ");
      this_00 = local_38;
      uVar2 = (ulong)*(uint *)(descriptor + 0x70);
      pcVar5 = "}";
      if (0 < (int)*(uint *)(descriptor + 0x70)) {
        lVar4 = 0;
        uVar7 = 0;
        do {
          WriteGeneratedCodeInfo
                    (this_00,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar4),printer,
                     uVar7 == (int)uVar2 - 1);
          uVar7 = uVar7 + 1;
          uVar2 = (ulong)*(int *)(descriptor + 0x70);
          lVar4 = lVar4 + 0x90;
        } while ((long)uVar7 < (long)uVar2);
      }
    }
    io::Printer::Print<>(printer,pcVar5);
    pcVar5 = "),\n";
    if (last) {
      pcVar5 = ")";
    }
    io::Printer::Print<>(printer,pcVar5);
    return;
  }
  io::Printer::Print<>(printer,"null, ");
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));

  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      fields.reserve(descriptor->field_count());
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", Join(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      oneofs.reserve(descriptor->oneof_decl_count());
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", Join(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      enums.reserve(descriptor->enum_type_count());
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", Join(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Extensions
  if (descriptor->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < descriptor->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(descriptor->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null.
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}